

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFunctionalTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderLibraryTest::init(ShaderLibraryTest *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  int extraout_EAX;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  char *pcVar1;
  size_type sVar2;
  reference ppTVar3;
  int local_bc;
  undefined1 local_b8 [4];
  int i;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string fileName;
  ShaderLibrary shaderLibrary;
  ShaderLibraryTest *this_local;
  
  testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
  contextInfo = Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)((long)&fileName.field_2 + 8),testCtx,renderCtx,contextInfo);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"shaders/",&local_89);
  pcVar1 = tcu::TestNode::getName((TestNode *)this);
  std::operator+(&local_68,&local_88,pcVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,".test");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b8,
             (ShaderLibrary *)((long)&fileName.field_2 + 8),pcVar1);
  local_bc = 0;
  while( true ) {
    sVar2 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                      ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b8);
    if ((int)sVar2 <= local_bc) break;
    ppTVar3 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                        ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b8,
                         (long)local_bc);
    tcu::TestNode::addChild((TestNode *)this,*ppTVar3);
    local_bc = local_bc + 1;
  }
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b8);
  std::__cxx11::string::~string((string *)local_48);
  deqp::gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)((long)&fileName.field_2 + 8));
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		gls::ShaderLibrary			shaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		std::string					fileName	= std::string("shaders/") + getName() + ".test";
		std::vector<tcu::TestNode*>	children	= shaderLibrary.loadShaderFile(fileName.c_str());

		for (int i = 0; i < (int)children.size(); i++)
			addChild(children[i]);
	}